

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

int Curl_resolv_timeout(connectdata *conn,char *hostname,int port,Curl_dns_entry **entry,
                       time_t timeoutms)

{
  Curl_easy *data_00;
  undefined8 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint __seconds;
  timediff_t tVar4;
  ulong uVar5;
  curltime cVar6;
  curltime older;
  curltime newer;
  time_t local_1b8;
  unsigned_long alarm_set;
  timediff_t elapsed_secs;
  int rc;
  Curl_easy *data;
  long lStack_178;
  uint prev_alarm;
  long timeout;
  sigaction sigact;
  undefined1 local_d0 [7];
  _Bool keep_copysig;
  sigaction keep_sigact;
  time_t timeoutms_local;
  Curl_dns_entry **entry_local;
  int port_local;
  char *hostname_local;
  connectdata *conn_local;
  
  sigact.sa_restorer._7_1_ = 0;
  data._4_4_ = 0;
  data_00 = conn->data;
  *entry = (Curl_dns_entry *)0x0;
  if (timeoutms < 0) {
    conn_local._4_4_ = -2;
  }
  else {
    if ((*(ulong *)&(data_00->set).field_0x878 >> 0x22 & 1) == 0) {
      local_1b8 = timeoutms;
      if (0x7fffffffffffffff < timeoutms) {
        local_1b8 = 0x7fffffffffffffff;
      }
      lStack_178 = local_1b8;
    }
    else {
      lStack_178 = 0;
    }
    keep_sigact.sa_restorer = (_func_void *)timeoutms;
    if (lStack_178 == 0) {
      conn_local._4_4_ = Curl_resolv(conn,hostname,port,true,entry);
    }
    else if (lStack_178 < 1000) {
      Curl_failf(data_00,"remaining timeout of %ld too small to resolve via SIGALRM method",
                 lStack_178);
      conn_local._4_4_ = -2;
    }
    else {
      iVar3 = __sigsetjmp(curl_jmpenv,1);
      if (iVar3 == 0) {
        sigaction(0xe,(sigaction *)0x0,(sigaction *)&timeout);
        memcpy(local_d0,&timeout,0x98);
        sigact.sa_restorer._7_1_ = 1;
        timeout = (long)alarmfunc;
        sigact.sa_mask.__val[0xf]._0_4_ = (uint)sigact.sa_mask.__val[0xf] & 0xefffffff;
        sigaction(0xe,(sigaction *)&timeout,(sigaction *)0x0);
        __seconds = curlx_sltoui(lStack_178 / 1000);
        data._4_4_ = alarm(__seconds);
        elapsed_secs._4_4_ = Curl_resolv(conn,hostname,port,true,entry);
      }
      else {
        Curl_failf(data_00,"name lookup timed out");
        elapsed_secs._4_4_ = -1;
      }
      if (data._4_4_ == 0) {
        alarm(0);
      }
      if ((sigact.sa_restorer._7_1_ & 1) != 0) {
        sigaction(0xe,(sigaction *)local_d0,(sigaction *)0x0);
      }
      if (data._4_4_ != 0) {
        cVar6 = Curl_now();
        uVar1 = (conn->created).tv_sec;
        uVar2 = (conn->created).tv_usec;
        older.tv_usec = uVar2;
        older.tv_sec = uVar1;
        older._12_4_ = 0;
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar6._0_12_,0);
        newer.tv_usec = SUB124(cVar6._0_12_,8);
        tVar4 = Curl_timediff(newer,older);
        uVar5 = (ulong)data._4_4_ - tVar4 / 1000;
        if ((uVar5 == 0) || ((0x7fffffff < uVar5 && (data._4_4_ < 0x80000000)))) {
          alarm(1);
          elapsed_secs._4_4_ = -2;
          Curl_failf(data_00,"Previous alarm fired off!");
        }
        else {
          alarm((uint)uVar5);
        }
      }
      conn_local._4_4_ = elapsed_secs._4_4_;
    }
  }
  return conn_local._4_4_;
}

Assistant:

int Curl_resolv_timeout(struct connectdata *conn,
                        const char *hostname,
                        int port,
                        struct Curl_dns_entry **entry,
                        time_t timeoutms)
{
#ifdef USE_ALARM_TIMEOUT
#ifdef HAVE_SIGACTION
  struct sigaction keep_sigact;   /* store the old struct here */
  volatile bool keep_copysig = FALSE; /* whether old sigact has been saved */
  struct sigaction sigact;
#else
#ifdef HAVE_SIGNAL
  void (*keep_sigact)(int);       /* store the old handler here */
#endif /* HAVE_SIGNAL */
#endif /* HAVE_SIGACTION */
  volatile long timeout;
  volatile unsigned int prev_alarm = 0;
  struct Curl_easy *data = conn->data;
#endif /* USE_ALARM_TIMEOUT */
  int rc;

  *entry = NULL;

  if(timeoutms < 0)
    /* got an already expired timeout */
    return CURLRESOLV_TIMEDOUT;

#ifdef USE_ALARM_TIMEOUT
  if(data->set.no_signal)
    /* Ignore the timeout when signals are disabled */
    timeout = 0;
  else
    timeout = (timeoutms > LONG_MAX) ? LONG_MAX : (long)timeoutms;

  if(!timeout)
    /* USE_ALARM_TIMEOUT defined, but no timeout actually requested */
    return Curl_resolv(conn, hostname, port, TRUE, entry);

  if(timeout < 1000) {
    /* The alarm() function only provides integer second resolution, so if
       we want to wait less than one second we must bail out already now. */
    failf(data,
        "remaining timeout of %ld too small to resolve via SIGALRM method",
        timeout);
    return CURLRESOLV_TIMEDOUT;
  }
  /* This allows us to time-out from the name resolver, as the timeout
     will generate a signal and we will siglongjmp() from that here.
     This technique has problems (see alarmfunc).
     This should be the last thing we do before calling Curl_resolv(),
     as otherwise we'd have to worry about variables that get modified
     before we invoke Curl_resolv() (and thus use "volatile"). */
  if(sigsetjmp(curl_jmpenv, 1)) {
    /* this is coming from a siglongjmp() after an alarm signal */
    failf(data, "name lookup timed out");
    rc = CURLRESOLV_ERROR;
    goto clean_up;
  }
  else {
    /*************************************************************
     * Set signal handler to catch SIGALRM
     * Store the old value to be able to set it back later!
     *************************************************************/
#ifdef HAVE_SIGACTION
    sigaction(SIGALRM, NULL, &sigact);
    keep_sigact = sigact;
    keep_copysig = TRUE; /* yes, we have a copy */
    sigact.sa_handler = alarmfunc;
#ifdef SA_RESTART
    /* HPUX doesn't have SA_RESTART but defaults to that behaviour! */
    sigact.sa_flags &= ~SA_RESTART;
#endif
    /* now set the new struct */
    sigaction(SIGALRM, &sigact, NULL);
#else /* HAVE_SIGACTION */
    /* no sigaction(), revert to the much lamer signal() */
#ifdef HAVE_SIGNAL
    keep_sigact = signal(SIGALRM, alarmfunc);
#endif
#endif /* HAVE_SIGACTION */

    /* alarm() makes a signal get sent when the timeout fires off, and that
       will abort system calls */
    prev_alarm = alarm(curlx_sltoui(timeout/1000L));
  }

#else
#ifndef CURLRES_ASYNCH
  if(timeoutms)
    infof(conn->data, "timeout on name lookup is not supported\n");
#else
  (void)timeoutms; /* timeoutms not used with an async resolver */
#endif
#endif /* USE_ALARM_TIMEOUT */

  /* Perform the actual name resolution. This might be interrupted by an
   * alarm if it takes too long.
   */
  rc = Curl_resolv(conn, hostname, port, TRUE, entry);

#ifdef USE_ALARM_TIMEOUT
clean_up:

  if(!prev_alarm)
    /* deactivate a possibly active alarm before uninstalling the handler */
    alarm(0);

#ifdef HAVE_SIGACTION
  if(keep_copysig) {
    /* we got a struct as it looked before, now put that one back nice
       and clean */
    sigaction(SIGALRM, &keep_sigact, NULL); /* put it back */
  }
#else
#ifdef HAVE_SIGNAL
  /* restore the previous SIGALRM handler */
  signal(SIGALRM, keep_sigact);
#endif
#endif /* HAVE_SIGACTION */

  /* switch back the alarm() to either zero or to what it was before minus
     the time we spent until now! */
  if(prev_alarm) {
    /* there was an alarm() set before us, now put it back */
    timediff_t elapsed_secs = Curl_timediff(Curl_now(),
                                            conn->created) / 1000;

    /* the alarm period is counted in even number of seconds */
    unsigned long alarm_set = prev_alarm - elapsed_secs;

    if(!alarm_set ||
       ((alarm_set >= 0x80000000) && (prev_alarm < 0x80000000)) ) {
      /* if the alarm time-left reached zero or turned "negative" (counted
         with unsigned values), we should fire off a SIGALRM here, but we
         won't, and zero would be to switch it off so we never set it to
         less than 1! */
      alarm(1);
      rc = CURLRESOLV_TIMEDOUT;
      failf(data, "Previous alarm fired off!");
    }
    else
      alarm((unsigned int)alarm_set);
  }
#endif /* USE_ALARM_TIMEOUT */

  return rc;
}